

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O0

void __thiscall
iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test<int>::Body
          (iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test<int> *this)

{
  AssertionHelper local_1c8;
  Fixed local_198;
  iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test<int> *local_10;
  iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test<int> *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  iutest::AssertionHelper::AssertionHelper
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/disabled_tests_decl.cpp"
             ,0x70,"Failed.\n",kFatalFailure);
  iutest::AssertionHelper::operator=(&local_1c8,&local_198);
  iutest::AssertionHelper::~AssertionHelper(&local_1c8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedFoo, DISABLED_Bar)
{
    IUTEST_FAIL();
}